

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::istream_cs_ext::parse_value(string *str)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  numeric *in_stack_ffffffffffffffb8;
  any *in_stack_ffffffffffffffc0;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,(char *)in_RDI);
  if (bVar1) {
    any::any<bool>(in_stack_ffffffffffffffc0,(bool *)in_stack_ffffffffffffffb8);
  }
  else {
    bVar1 = std::operator==(__lhs,(char *)in_RDI);
    if (bVar1) {
      any::any<bool>(in_stack_ffffffffffffffc0,(bool *)in_stack_ffffffffffffffb8);
    }
    else {
      cs::parse_number(in_stack_00000038);
      any::any<cs::numeric>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  return (var)(proxy *)__lhs;
}

Assistant:

var parse_value(const std::string &str)
		{
			if (str == "true")
				return true;
			if (str == "false")
				return false;
			try {
				return parse_number(str);
			}
			catch (...) {
				return str;
			}
			return str;
		}